

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

void __thiscall CompileCommandParser::ParseTranslationUnit(CompileCommandParser *this)

{
  bool bVar1;
  mapped_type *this_00;
  allocator local_d9;
  string local_d8;
  string local_b8 [8];
  string value;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string name;
  CompileCommandParser *this_local;
  
  memset((void *)((long)&name.field_2 + 8),0,0x30);
  CommandType::CommandType((CommandType *)((long)&name.field_2 + 8));
  CommandType::operator=(&this->Command,(CommandType *)((long)&name.field_2 + 8));
  CommandType::~CommandType((CommandType *)((long)&name.field_2 + 8));
  bVar1 = Expect(this,'{');
  if ((bVar1) && (bVar1 = Expect(this,'}'), !bVar1)) {
    do {
      ParseString(this);
      std::__cxx11::string::string((string *)local_60,(string *)&this->String);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"between name and value",&local_81);
      ExpectOrDie(this,':',&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      ParseString(this);
      std::__cxx11::string::string(local_b8,(string *)&this->String);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&(this->Command).
                              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ,(key_type *)local_60);
      std::__cxx11::string::operator=((string *)this_00,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)local_60);
      bVar1 = Expect(this,',');
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"at end of object",&local_d9);
    ExpectOrDie(this,'}',&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  return;
}

Assistant:

void ParseTranslationUnit()
  {
    this->Command = CommandType();
    if(!Expect('{')) return;
    if(Expect('}')) return;
    do
      {
      ParseString();
      std::string name = this->String;
      ExpectOrDie(':', "between name and value");
      ParseString();
      std::string value = this->String;
      this->Command[name] = value;
      } while(Expect(','));
    ExpectOrDie('}', "at end of object");
  }